

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerHLSL::type_to_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,SPIRType *type,uint32_t id)

{
  uint32_t *ts;
  bool bVar1;
  BaseType BVar2;
  const_iterator cVar3;
  CompilerError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  uint32_t *ts_00;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  uint32_t local_34;
  allocator local_30 [16];
  undefined1 local_20 [16];
  uint *ts_3;
  
  BVar2 = type->basetype;
  local_34 = id;
  if ((int)BVar2 < 0x10) {
    if (BVar2 == Void) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar5 = "void";
      pcVar4 = "";
      goto LAB_00229499;
    }
    if (BVar2 == Struct) {
      if ((this->super_CompilerGLSL).backend.explicit_struct_type != true) {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (__return_storage_ptr__,this,(ulong)(type->super_IVariant).self.id,1);
        return __return_storage_ptr__;
      }
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                ((char (*) [8])local_30,this,(ulong)(type->super_IVariant).self.id);
      join<char_const(&)[8],std::__cxx11::string>
                (__return_storage_ptr__,(spirv_cross *)0x3b6712,(char (*) [8])local_30,ts_1);
      if ((undefined1 *)local_30._0_8_ == local_20) {
        return __return_storage_ptr__;
      }
      operator_delete((void *)local_30._0_8_);
      return __return_storage_ptr__;
    }
  }
  else {
    if (BVar2 - Image < 2) {
      image_type_hlsl_abi_cxx11_(__return_storage_ptr__,this,type,id);
      return __return_storage_ptr__;
    }
    if (BVar2 == Sampler) {
      cVar3 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&(this->super_CompilerGLSL).super_Compiler.comparison_ids._M_h,&local_34);
      pcVar5 = "SamplerComparisonState";
      if (cVar3.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
        pcVar5 = "SamplerState";
      }
      pcVar4 = pcVar5 + 0x16;
      if (cVar3.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
        pcVar4 = pcVar5 + 0xc;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      goto LAB_00229499;
    }
  }
  uVar6 = type->columns ^ 1 | type->vecsize ^ 1;
  ts_3 = (uint *)(ulong)uVar6;
  if (uVar6 == 0) {
    switch(BVar2) {
    case Boolean:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar5 = "bool";
      pcVar4 = "";
      break;
    default:
      goto switchD_002294df_caseD_3;
    case Short:
      bVar1 = (this->hlsl_options).enable_16bit_types;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if (bVar1 == true) {
        pcVar5 = "int16_t";
        pcVar4 = "";
      }
      else {
        pcVar5 = "min16int";
        pcVar4 = "";
      }
      break;
    case UShort:
      bVar1 = (this->hlsl_options).enable_16bit_types;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if (bVar1 == true) {
        pcVar5 = "uint16_t";
        pcVar4 = "";
      }
      else {
        pcVar5 = "min16uint";
        pcVar4 = "";
      }
      break;
    case Int:
      pcVar5 = (this->super_CompilerGLSL).backend.basic_int_type;
      goto LAB_0022960c;
    case UInt:
      pcVar5 = (this->super_CompilerGLSL).backend.basic_uint_type;
LAB_0022960c:
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar5,local_30);
      return __return_storage_ptr__;
    case Int64:
      if ((this->hlsl_options).shader_model < 0x3c) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"64-bit integers only supported in SM 6.0.");
LAB_002298e4:
        __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar5 = "int64_t";
      pcVar4 = "";
      break;
    case UInt64:
      if ((this->hlsl_options).shader_model < 0x3c) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"64-bit integers only supported in SM 6.0.");
        goto LAB_002298e4;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar5 = "uint64_t";
      pcVar4 = "";
      break;
    case AtomicCounter:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar5 = "atomic_uint";
      pcVar4 = "";
      break;
    case Half:
      bVar1 = (this->hlsl_options).enable_16bit_types;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if (bVar1 == true) {
        pcVar5 = "half";
        pcVar4 = "";
      }
      else {
        pcVar5 = "min16float";
        pcVar4 = "";
      }
      break;
    case Float:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar5 = "float";
      pcVar4 = "";
      break;
    case Double:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar5 = "double";
      pcVar4 = "";
      break;
    case AccelerationStructure:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar5 = "RaytracingAccelerationStructure";
      pcVar4 = "";
      break;
    case RayQuery:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar5 = "RayQuery<RAY_FLAG_NONE>";
      pcVar4 = "";
    }
LAB_00229499:
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar5,pcVar4);
    return __return_storage_ptr__;
  }
  ts = &type->vecsize;
  uVar6 = BVar2 - Boolean;
  if (type->vecsize < 2 || type->columns != 1) {
    if (0xc < uVar6) {
switchD_002294df_caseD_3:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar5 = "???";
      pcVar4 = "";
      goto LAB_00229499;
    }
    ts_00 = &type->columns;
    switch(uVar6) {
    case 0:
      pcVar5 = "bool";
      goto LAB_0022979e;
    default:
      goto switchD_002294df_caseD_3;
    case 3:
      pcVar5 = "int16_t";
      local_30._0_8_ = "min16int";
      break;
    case 4:
      pcVar5 = "uint16_t";
      local_30._0_8_ = "min16uint";
      break;
    case 5:
      join<char_const(&)[4],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                (__return_storage_ptr__,(spirv_cross *)0x3c9164,(char (*) [4])ts_00,(uint *)0x3faf22
                 ,(char (*) [2])ts,ts_3);
      return __return_storage_ptr__;
    case 6:
      pcVar5 = "uint";
LAB_0022979e:
      join<char_const(&)[5],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                (__return_storage_ptr__,(spirv_cross *)pcVar5,(char (*) [5])ts_00,(uint *)0x3faf22,
                 (char (*) [2])ts,ts_3);
      return __return_storage_ptr__;
    case 10:
      pcVar5 = "half";
      local_30._0_8_ = "min16float";
      break;
    case 0xb:
      join<char_const(&)[6],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                (__return_storage_ptr__,(spirv_cross *)0x3e8a41,(char (*) [6])ts_00,(uint *)0x3faf22
                 ,(char (*) [2])ts,ts_3);
      return __return_storage_ptr__;
    case 0xc:
      join<char_const(&)[7],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                (__return_storage_ptr__,(spirv_cross *)0x3e7669,(char (*) [7])ts_00,(uint *)0x3faf22
                 ,(char (*) [2])ts,ts_3);
      return __return_storage_ptr__;
    }
    if ((this->hlsl_options).enable_16bit_types != false) {
      local_30._0_8_ = pcVar5;
    }
    join<char_const*,unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
              (__return_storage_ptr__,(spirv_cross *)local_30,(char **)ts_00,(uint *)0x3faf22,
               (char (*) [2])ts,ts_3);
    return __return_storage_ptr__;
  }
  switch(uVar6) {
  case 0:
    pcVar5 = "bool";
    goto LAB_00229833;
  default:
    goto switchD_002294df_caseD_3;
  case 3:
    pcVar5 = "int16_t";
    local_30._0_8_ = "min16int";
    break;
  case 4:
    pcVar5 = "uint16_t";
    local_30._0_8_ = "min16uint";
    break;
  case 5:
    join<char_const(&)[4],unsigned_int_const&>
              (__return_storage_ptr__,(spirv_cross *)0x3c9164,(char (*) [4])ts,
               &switchD_0022953a::switchdataD_003e3c10);
    return __return_storage_ptr__;
  case 6:
    pcVar5 = "uint";
LAB_00229833:
    join<char_const(&)[5],unsigned_int_const&>
              (__return_storage_ptr__,(spirv_cross *)pcVar5,(char (*) [5])ts,
               &switchD_0022953a::switchdataD_003e3c10);
    return __return_storage_ptr__;
  case 7:
    pcVar5 = "i64vec";
    goto LAB_0022984a;
  case 8:
    pcVar5 = "u64vec";
    goto LAB_0022984a;
  case 10:
    pcVar5 = "half";
    local_30._0_8_ = "min16float";
    break;
  case 0xb:
    join<char_const(&)[6],unsigned_int_const&>
              (__return_storage_ptr__,(spirv_cross *)0x3e8a41,(char (*) [6])ts,
               &switchD_0022953a::switchdataD_003e3c10);
    return __return_storage_ptr__;
  case 0xc:
    pcVar5 = "double";
LAB_0022984a:
    join<char_const(&)[7],unsigned_int_const&>
              (__return_storage_ptr__,(spirv_cross *)pcVar5,(char (*) [7])ts,
               &switchD_0022953a::switchdataD_003e3c10);
    return __return_storage_ptr__;
  }
  if ((this->hlsl_options).enable_16bit_types != false) {
    local_30._0_8_ = pcVar5;
  }
  join<char_const*,unsigned_int_const&>
            (__return_storage_ptr__,(spirv_cross *)local_30,(char **)ts,(uint *)local_30._0_8_);
  return __return_storage_ptr__;
}

Assistant:

string CompilerHLSL::type_to_glsl(const SPIRType &type, uint32_t id)
{
	// Ignore the pointer type since GLSL doesn't have pointers.

	switch (type.basetype)
	{
	case SPIRType::Struct:
		// Need OpName lookup here to get a "sensible" name for a struct.
		if (backend.explicit_struct_type)
			return join("struct ", to_name(type.self));
		else
			return to_name(type.self);

	case SPIRType::Image:
	case SPIRType::SampledImage:
		return image_type_hlsl(type, id);

	case SPIRType::Sampler:
		return comparison_ids.count(id) ? "SamplerComparisonState" : "SamplerState";

	case SPIRType::Void:
		return "void";

	default:
		break;
	}

	if (type.vecsize == 1 && type.columns == 1) // Scalar builtin
	{
		switch (type.basetype)
		{
		case SPIRType::Boolean:
			return "bool";
		case SPIRType::Int:
			return backend.basic_int_type;
		case SPIRType::UInt:
			return backend.basic_uint_type;
		case SPIRType::AtomicCounter:
			return "atomic_uint";
		case SPIRType::Half:
			if (hlsl_options.enable_16bit_types)
				return "half";
			else
				return "min16float";
		case SPIRType::Short:
			if (hlsl_options.enable_16bit_types)
				return "int16_t";
			else
				return "min16int";
		case SPIRType::UShort:
			if (hlsl_options.enable_16bit_types)
				return "uint16_t";
			else
				return "min16uint";
		case SPIRType::Float:
			return "float";
		case SPIRType::Double:
			return "double";
		case SPIRType::Int64:
			if (hlsl_options.shader_model < 60)
				SPIRV_CROSS_THROW("64-bit integers only supported in SM 6.0.");
			return "int64_t";
		case SPIRType::UInt64:
			if (hlsl_options.shader_model < 60)
				SPIRV_CROSS_THROW("64-bit integers only supported in SM 6.0.");
			return "uint64_t";
		case SPIRType::AccelerationStructure:
			return "RaytracingAccelerationStructure";
		case SPIRType::RayQuery:
			return "RayQuery<RAY_FLAG_NONE>";
		default:
			return "???";
		}
	}
	else if (type.vecsize > 1 && type.columns == 1) // Vector builtin
	{
		switch (type.basetype)
		{
		case SPIRType::Boolean:
			return join("bool", type.vecsize);
		case SPIRType::Int:
			return join("int", type.vecsize);
		case SPIRType::UInt:
			return join("uint", type.vecsize);
		case SPIRType::Half:
			return join(hlsl_options.enable_16bit_types ? "half" : "min16float", type.vecsize);
		case SPIRType::Short:
			return join(hlsl_options.enable_16bit_types ? "int16_t" : "min16int", type.vecsize);
		case SPIRType::UShort:
			return join(hlsl_options.enable_16bit_types ? "uint16_t" : "min16uint", type.vecsize);
		case SPIRType::Float:
			return join("float", type.vecsize);
		case SPIRType::Double:
			return join("double", type.vecsize);
		case SPIRType::Int64:
			return join("i64vec", type.vecsize);
		case SPIRType::UInt64:
			return join("u64vec", type.vecsize);
		default:
			return "???";
		}
	}
	else
	{
		switch (type.basetype)
		{
		case SPIRType::Boolean:
			return join("bool", type.columns, "x", type.vecsize);
		case SPIRType::Int:
			return join("int", type.columns, "x", type.vecsize);
		case SPIRType::UInt:
			return join("uint", type.columns, "x", type.vecsize);
		case SPIRType::Half:
			return join(hlsl_options.enable_16bit_types ? "half" : "min16float", type.columns, "x", type.vecsize);
		case SPIRType::Short:
			return join(hlsl_options.enable_16bit_types ? "int16_t" : "min16int", type.columns, "x", type.vecsize);
		case SPIRType::UShort:
			return join(hlsl_options.enable_16bit_types ? "uint16_t" : "min16uint", type.columns, "x", type.vecsize);
		case SPIRType::Float:
			return join("float", type.columns, "x", type.vecsize);
		case SPIRType::Double:
			return join("double", type.columns, "x", type.vecsize);
		// Matrix types not supported for int64/uint64.
		default:
			return "???";
		}
	}
}